

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O0

bool __thiscall
BamTools::FilterTool::FilterToolPrivate::ParseFilterObject
          (FilterToolPrivate *this,string *filterName,Value *filterObject)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  iterator filterName_00;
  reference __x;
  Value *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  Value *in_stack_00000088;
  string *propertyName;
  const_iterator propertyNameEnd;
  const_iterator propertyNameIter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  propertyTokens;
  Value propertyValue;
  Value null;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  ValueType vtype;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 uVar5;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea1;
  string local_158 [64];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  FilterToolPrivate *in_stack_fffffffffffffef8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff50;
  
  vtype = (ValueType)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  uVar5 = 0;
  Json::Value::Value((Value *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),vtype);
  Json::Value::Value((Value *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),vtype);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x200a9f);
  filterName_00 =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe6f,
                           CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe70._M_node,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe6f,
                         CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT17(in_stack_fffffffffffffe6f,
                    CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe70._M_node,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe6f,
                         CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffe70._M_node,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe6f,
                                        CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68
                                                ))), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&stack0xffffffffffffff50);
    Json::Value::get((Value *)in_stack_fffffffffffffe98._M_node,
                     (string *)CONCAT44(uVar5,in_stack_fffffffffffffe90),in_RDI);
    Json::Value::operator=
              ((Value *)in_stack_fffffffffffffe70._M_node,
               (Value *)CONCAT17(in_stack_fffffffffffffe6f,
                                 CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
    Json::Value::~Value((Value *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0));
    uVar2 = Json::Value::operator!=
                      ((Value *)in_stack_fffffffffffffe70._M_node,
                       (Value *)CONCAT17(in_stack_fffffffffffffe6f,
                                         CONCAT16(in_stack_fffffffffffffe6e,
                                                  in_stack_fffffffffffffe68)));
    if ((bool)uVar2) {
      Json::Value::asString_abi_cxx11_(in_stack_00000088);
      std::make_pair<std::__cxx11::string_const&,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
                 (RuleToken *)in_stack_fffffffffffffe70._M_node);
      _Var4 = std::
              map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT17(uVar2,in_stack_fffffffffffffe80),
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)__x);
      in_stack_fffffffffffffe70 = _Var4.first._M_node;
      in_stack_fffffffffffffe6f = _Var4.second;
      in_stack_fffffffffffffe98._M_node = in_stack_fffffffffffffe70._M_node;
      in_stack_fffffffffffffea0 = in_stack_fffffffffffffe6f;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe70._M_node);
      std::__cxx11::string::~string(local_158);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&stack0xffffffffffffff50);
  }
  FilterEngine<BamTools::BamAlignmentChecker>::addFilter
            ((FilterEngine<BamTools::BamAlignmentChecker> *)in_stack_ffffffffffffff50._M_current,
             filterName_00._M_current);
  bVar3 = AddPropertyTokensToFilter
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x200d06);
  Json::Value::~Value((Value *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0));
  Json::Value::~Value((Value *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0));
  return (bool)(bVar3 & 1);
}

Assistant:

bool FilterTool::FilterToolPrivate::ParseFilterObject(const std::string& filterName,
                                                      const Json::Value& filterObject)
{

    // filter object parsing variables
    Json::Value null(Json::nullValue);
    Json::Value propertyValue;

    // store results
    std::map<std::string, std::string> propertyTokens;

    // iterate over known properties
    std::vector<std::string>::const_iterator propertyNameIter = m_propertyNames.begin();
    std::vector<std::string>::const_iterator propertyNameEnd = m_propertyNames.end();
    for (; propertyNameIter != propertyNameEnd; ++propertyNameIter) {
        const std::string& propertyName = (*propertyNameIter);

        // if property defined in filter, add to token list
        propertyValue = filterObject.get(propertyName, null);
        if (propertyValue != null)
            propertyTokens.insert(make_pair(propertyName, propertyValue.asString()));
    }

    // add this filter to engin
    m_filterEngine.addFilter(filterName);

    // add token list to this filter
    return AddPropertyTokensToFilter(filterName, propertyTokens);
}